

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O3

void __thiscall
google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
          (InternalMetadataWithArena *this,UnknownFieldSet *other)

{
  void *pvVar1;
  UnknownFieldSet *this_00;
  
  pvVar1 = (this->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    this_00 = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ::mutable_unknown_fields_slow
                        (&this->
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        );
  }
  else {
    this_00 = (UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  UnknownFieldSet::MergeFrom(this_00,other);
  return;
}

Assistant:

void DoMergeFrom(const UnknownFieldSet& other) {
    mutable_unknown_fields()->MergeFrom(other);
  }